

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png_io.cc
# Opt level: O0

void __thiscall gimage::PNGImageIO::save(PNGImageIO *this,ImageU8 *image,char *name)

{
  store_t sVar1;
  int iVar2;
  ulong uVar3;
  undefined8 uVar4;
  __jmp_buf_tag *__env;
  ulong uVar5;
  char *pcVar6;
  long lVar7;
  long lVar8;
  char *in_RDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  long *in_RDI;
  int j;
  long i;
  uchar *rp;
  long k;
  png_text text [2];
  string tm;
  time_t tt;
  string vs;
  int color;
  uchar *row;
  png_infop info;
  png_structp png;
  FILE *out;
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  undefined4 in_stack_fffffffffffffbe8;
  undefined4 in_stack_fffffffffffffbec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc10;
  string *in_stack_fffffffffffffc18;
  IOException *in_stack_fffffffffffffc20;
  int local_304;
  long local_300;
  store_t *local_2f8;
  long local_2f0;
  undefined8 local_2e8;
  char *pcStack_2e0;
  char *local_2d8;
  size_t sStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  char *local_2a8;
  char *pcStack_2a0;
  size_t local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  allocator local_269;
  string local_268 [32];
  time_t local_248;
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [32];
  string local_1f0 [32];
  undefined4 local_1d0;
  undefined1 local_1ca;
  allocator local_1c9;
  string local_1c8 [96];
  store_t *local_168;
  undefined1 local_15a;
  allocator local_159;
  string local_158 [32];
  long local_138;
  undefined1 local_12a;
  allocator local_129;
  string local_128 [32];
  long local_108;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [96];
  FILE *local_98;
  undefined1 local_8d;
  allocator local_79;
  string local_78 [96];
  char *local_18;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  uVar3 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_RDX,0);
  if (((uVar3 & 1) == 0) ||
     ((iVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10),
      iVar2 != 1 &&
      (iVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10),
      iVar2 != 3)))) {
    local_8d = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,local_18,&local_79);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                   (char *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    gutil::IOException::IOException(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    local_8d = 0;
    __cxa_throw(uVar4,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_98 = fopen(local_18,"wb");
  if (local_98 == (FILE *)0x0) {
    local_fa = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_f8,local_18,&local_f9);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                   (char *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    gutil::IOException::IOException(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    local_fa = 0;
    __cxa_throw(uVar4,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  local_108 = png_create_write_struct("1.6.37",0,0);
  if (local_108 != 0) {
    local_138 = png_create_info_struct(local_108);
    if (local_138 == 0) {
      png_destroy_write_struct(&local_108,0);
      fclose(local_98);
      local_15a = 1;
      uVar4 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_158,"Cannot allocate PNG info structure",&local_159);
      gutil::IOException::IOException(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
      local_15a = 0;
      __cxa_throw(uVar4,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
    }
    local_168 = (store_t *)0x0;
    __env = (__jmp_buf_tag *)png_set_longjmp_fn(local_108,longjmp,200);
    iVar2 = _setjmp(__env);
    if (iVar2 == 0) {
      png_init_io(local_108,local_98);
      local_1d0 = 0;
      iVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10);
      lVar8 = local_108;
      lVar7 = local_138;
      if (iVar2 == 3) {
        local_1d0 = 2;
      }
      uVar3 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_10);
      uVar5 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_10);
      png_set_IHDR(lVar8,lVar7,uVar3 & 0xffffffff,uVar5 & 0xffffffff,8,local_1d0,0,0,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,"cvkit version ",&local_211);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_238,"2.6.17",&local_239);
      std::operator+(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10);
      std::__cxx11::string::~string(local_238);
      std::allocator<char>::~allocator((allocator<char> *)&local_239);
      std::__cxx11::string::~string(local_210);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      local_248 = time((time_t *)0x0);
      pcVar6 = ctime(&local_248);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_268,pcVar6,&local_269);
      std::allocator<char>::~allocator((allocator<char> *)&local_269);
      local_288 = 0;
      uStack_280 = 0;
      local_298 = 0;
      uStack_290 = 0;
      local_2a8 = (char *)0x0;
      pcStack_2a0 = (char *)0x0;
      local_2b8 = 0;
      uStack_2b0 = 0;
      local_2c8 = 0;
      uStack_2c0 = 0;
      local_2d8 = (char *)0x0;
      sStack_2d0 = 0;
      local_2e8 = 0xffffffff;
      pcStack_2e0 = "Software";
      local_2d8 = (char *)std::__cxx11::string::c_str();
      sStack_2d0 = strlen(local_2d8);
      uStack_2b0 = CONCAT44(uStack_2b0._4_4_,0xffffffff);
      local_2a8 = "Creation Time";
      pcStack_2a0 = (char *)std::__cxx11::string::c_str();
      local_298 = strlen(pcStack_2a0);
      png_set_text(local_108,local_138,&local_2e8,2);
      png_write_info(local_108,local_138);
      iVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10);
      lVar7 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_10);
      uVar3 = iVar2 * lVar7;
      if ((long)uVar3 < 0) {
        uVar3 = 0xffffffffffffffff;
      }
      local_168 = (store_t *)operator_new__(uVar3);
      local_2f0 = 0;
      while (lVar7 = local_2f0,
            lVar8 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_10),
            lVar7 < lVar8) {
        local_2f8 = local_168;
        local_300 = 0;
        while (lVar7 = local_300,
              lVar8 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_10),
              lVar7 < lVar8) {
          for (local_304 = 0;
              iVar2 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getDepth(local_10),
              local_304 < iVar2; local_304 = local_304 + 1) {
            sVar1 = Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::get
                              (local_10,local_300,local_2f0,local_304);
            *local_2f8 = sVar1;
            local_2f8 = local_2f8 + 1;
          }
          local_300 = local_300 + 1;
        }
        png_write_row(local_108,local_168);
        local_2f0 = local_2f0 + 1;
      }
      png_write_end(local_108,local_138);
      if (local_168 != (store_t *)0x0) {
        operator_delete__(local_168);
      }
      fclose(local_98);
      png_destroy_write_struct(&local_108,&local_138);
      std::__cxx11::string::~string(local_268);
      std::__cxx11::string::~string(local_1f0);
      return;
    }
    if (local_168 != (store_t *)0x0) {
      operator_delete__(local_168);
    }
    png_destroy_write_struct(&local_108,&local_138);
    fclose(local_98);
    local_1ca = 1;
    uVar4 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1c8,local_18,&local_1c9);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8),
                   (char *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0));
    gutil::IOException::IOException(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
    local_1ca = 0;
    __cxa_throw(uVar4,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  fclose(local_98);
  local_12a = 1;
  uVar4 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"Cannot allocate handle for writing PNG files",&local_129);
  gutil::IOException::IOException(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  local_12a = 0;
  __cxa_throw(uVar4,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

void PNGImageIO::save(const ImageU8 &image, const char *name) const
{
  if (!handlesFile(name, false) || (image.getDepth() != 1 && image.getDepth() != 3))
  {
    throw gutil::IOException("Can only save PNG images with depth 1 or 3 ("+std::string(name)+")");
  }

  // initialize writing a png file

  FILE *out=fopen(name, "wb");

  if (out == 0)
  {
    throw gutil::IOException("Cannot open file ("+std::string(name)+")");
  }

  png_structp png=png_create_write_struct(PNG_LIBPNG_VER_STRING, 0, 0, 0);

  if (png == 0)
  {
    fclose(out);
    throw gutil::IOException("Cannot allocate handle for writing PNG files");
  }

  png_infop info=png_create_info_struct(png);

  if (info == 0)
  {
    png_destroy_write_struct(&png, static_cast<png_infopp>(0));
    fclose(out);
    throw gutil::IOException("Cannot allocate PNG info structure");
  }

  unsigned char *row=0;

  if (setjmp(png_jmpbuf(png)))
  {
    delete [] row;

    png_destroy_write_struct(&png, &info);
    fclose(out);
    throw gutil::IOException("Cannot read PNG file ("+std::string(name)+")");
  }

  // write header

  png_init_io(png, out);

  int color=PNG_COLOR_TYPE_GRAY;

  if (image.getDepth() == 3)
  {
    color=PNG_COLOR_TYPE_RGB;
  }

  png_set_IHDR(png, info, image.getWidth(), image.getHeight(), 8, color,
               PNG_INTERLACE_NONE, PNG_COMPRESSION_TYPE_DEFAULT,
               PNG_FILTER_TYPE_DEFAULT);

  std::string vs=std::string("cvkit version ")+std::string(VERSION);

  time_t tt=time(0);
  std::string tm=ctime(&tt);

  png_text text[2];
  memset(text, 0, 2*sizeof(png_text));

  text[0].compression=PNG_TEXT_COMPRESSION_NONE;
  text[0].key=const_cast<char *>("Software");
  text[0].text=const_cast<char *>(vs.c_str());
  text[0].text_length=strlen(text[0].text);

  text[1].compression=PNG_TEXT_COMPRESSION_NONE;
  text[1].key=const_cast<char *>("Creation Time");
  text[1].text=const_cast<char *>(tm.c_str());
  text[1].text_length=strlen(text[1].text);

  png_set_text(png, info, text, 2);

  png_write_info(png, info);

  // write image

  row=new unsigned char [image.getDepth()*image.getWidth()];

  // write image content line by line

  for (long k=0; k<image.getHeight(); k++)
  {
    unsigned char *rp=row;

    for (long i=0; i<image.getWidth(); i++)
    {
      for (int j=0; j<image.getDepth(); j++)
      {
        *rp++=image.get(i, k, j);
      }
    }

    png_write_row(png, row);
  }

  // finish writing and close file

  png_write_end(png, info);

  delete [] row;

  fclose(out);

  png_destroy_write_struct(&png, &info);
}